

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<double>::PrepareZ
          (TPZMatrix<double> *this,TPZFMatrix<double> *y,TPZFMatrix<double> *z,double beta,int opt)

{
  int64_t iVar1;
  double *pdVar2;
  int in_ECX;
  TPZFMatrix<double> *in_RDX;
  TPZFMatrix<double> *in_RSI;
  TPZBaseMatrix *in_RDI;
  double in_XMM0_Qa;
  int64_t i;
  double *yp;
  double *zlast;
  double *zp;
  int64_t ic;
  int64_t xcols;
  int64_t numeq;
  long local_70;
  long in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  TPZFMatrix<double> *in_stack_ffffffffffffffb0;
  TPZFMatrix<double> *local_48;
  long local_40;
  
  if (in_ECX == 0) {
    local_70 = TPZBaseMatrix::Rows(in_RDI);
  }
  else {
    local_70 = TPZBaseMatrix::Cols(in_RDI);
  }
  iVar1 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
  (*(in_RDX->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (in_RDX,local_70,iVar1);
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    local_48 = (TPZFMatrix<double> *)
               TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                          in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffb0 =
         (TPZFMatrix<double> *)
         (&((TPZFMatrix<double> *)(&local_48->fPivot + -1))->fElem + local_70 + -4);
    if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
      in_stack_ffffffffffffffa8 = TPZFMatrix<double>::g(in_RSI,0,local_40);
      if (in_RDX != in_RSI) {
        memcpy(local_48,in_stack_ffffffffffffffa8,local_70 << 3);
      }
      for (in_stack_ffffffffffffffa0 = 0; in_stack_ffffffffffffffa0 < local_70;
          in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
        pdVar2 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa0);
        *pdVar2 = in_XMM0_Qa * *pdVar2;
      }
    }
    else {
      for (; local_48 != in_stack_ffffffffffffffb0;
          local_48 = (TPZFMatrix<double> *)
                     &(local_48->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) {
        (local_48->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)0x0;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}